

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  u8 uVar1;
  sqlite3 *db;
  ExprList_item *pEVar2;
  Table *pTVar3;
  Column **ppCVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  Column *p;
  Expr *pEVar8;
  Column *pCVar9;
  byte *pKey;
  void *pvVar10;
  Column *pCVar11;
  i16 *extraout_RAX;
  i16 *piVar12;
  ulong uVar13;
  byte bVar14;
  char *pcVar15;
  long lVar16;
  u32 cnt;
  ulong local_78;
  Column *local_70;
  i16 *local_68;
  Column **local_60;
  ExprList *local_58;
  ulong local_50;
  Hash ht;
  
  db = pParse->db;
  ht.ht = (_ht *)0x0;
  ht.htsize = 0;
  ht.count = 0;
  ht.first = (HashElem *)0x0;
  if (pEList == (ExprList *)0x0) {
    p = (Column *)0x0;
    uVar7 = 0;
  }
  else {
    uVar7 = pEList->nExpr;
    p = (Column *)sqlite3DbMallocZero(db,(long)(int)uVar7 << 5);
  }
  *pnCol = (i16)uVar7;
  *paCol = p;
  local_78 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    local_78 = 0;
  }
  uVar13 = 0;
  pCVar9 = p;
  local_68 = pnCol;
  local_60 = paCol;
  local_58 = pEList;
  do {
    uVar5 = local_78;
    if ((uVar13 == local_78) || (uVar5 = uVar13, db->mallocFailed != '\0')) {
      local_78 = uVar5;
      sqlite3HashClear(&ht);
      ppCVar4 = local_60;
      piVar12 = extraout_RAX;
      if (db->mallocFailed != '\0') {
        uVar13 = local_78 & 0xffffffff;
        for (lVar16 = 0; uVar13 << 5 != lVar16; lVar16 = lVar16 + 0x20) {
          sqlite3DbFree(db,*(void **)((long)&p->zName + lVar16));
        }
        sqlite3DbFree(db,p);
        *ppCVar4 = (Column *)0x0;
        *local_68 = 0;
        piVar12 = local_68;
      }
      return (int)piVar12;
    }
    pEVar2 = local_58->a;
    local_70 = pCVar9;
    local_50 = uVar13;
    pEVar8 = sqlite3ExprSkipCollate(pEVar2[uVar13].pExpr);
    pcVar15 = pEVar2[uVar13].zName;
    if (pcVar15 == (char *)0x0) {
      for (; uVar1 = pEVar8->op, uVar1 == 'z'; pEVar8 = pEVar8->pRight) {
      }
      if (uVar1 == '7') {
        pCVar9 = (Column *)&pEVar8->u;
      }
      else if ((uVar1 == 0x98) && (pTVar3 = pEVar8->pTab, pTVar3 != (Table *)0x0)) {
        uVar6 = pEVar8->iColumn;
        if ((short)uVar6 < 0) {
          uVar6 = pTVar3->iPKey;
          pcVar15 = "rowid";
          if ((short)uVar6 < 0) goto LAB_00154a61;
        }
        pCVar9 = pTVar3->aCol + uVar6;
      }
      else {
        pCVar9 = (Column *)&pEVar2[uVar13].zSpan;
      }
      pcVar15 = pCVar9->zName;
    }
LAB_00154a61:
    pKey = (byte *)sqlite3MPrintf(db,"%s",pcVar15);
    cnt = 0;
    while (pKey != (byte *)0x0) {
      pvVar10 = sqlite3HashFind(&ht,(char *)pKey);
      pCVar9 = local_70;
      if (pvVar10 == (void *)0x0) {
        local_70->zName = (char *)pKey;
        pCVar11 = (Column *)sqlite3HashInsert(&ht,(char *)pKey,local_70);
        if (pCVar11 == pCVar9) {
          sqlite3OomFault(db);
        }
        goto LAB_00154b42;
      }
      uVar7 = sqlite3Strlen30((char *)pKey);
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar13 = (ulong)uVar7;
        do {
          if (uVar13 < 2) {
            bVar14 = *pKey;
            uVar13 = 0;
            break;
          }
          uVar13 = uVar13 - 1;
          bVar14 = pKey[uVar13 & 0xffffffff];
        } while (0xfffffffffffffff5 < (ulong)bVar14 - 0x3a);
        if (bVar14 == 0x3a) {
          uVar7 = (uint)uVar13;
        }
      }
      cnt = cnt + 1;
      pKey = (byte *)sqlite3MPrintf(db,"%.*z:%u",(ulong)uVar7,pKey);
      if (3 < cnt) {
        sqlite3_randomness(4,&cnt);
      }
    }
    local_70->zName = (char *)0x0;
    pCVar9 = local_70;
LAB_00154b42:
    uVar13 = local_50 + 1;
    pCVar9 = pCVar9 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  Expr *p;                    /* Expression for a single result column */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    p = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = p;  /* The expression that is the result column name */
      Table *pTab;         /* Table associated with this expression */
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && ALWAYS(pColExpr->pTab!=0) ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    zName = sqlite3MPrintf(db, "%s", zName);

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}